

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

VectorSet * __thiscall
TreeIncPruneBGPlanner::GetGaoa(TreeIncPruneBGPlanner *this,Index a,Index o,Index aPrime)

{
  E *this_00;
  undefined8 uVar1;
  reference ppmVar2;
  int in_ECX;
  index in_stack_ffffffffffffff38;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar3;
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
  *in_stack_ffffffffffffff40;
  undefined1 *idx;
  multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL>
  *in_stack_ffffffffffffff58;
  undefined1 local_58 [68];
  int local_14;
  
  idx = local_58;
  local_14 = in_ECX;
  boost::
  multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL>
  ::operator[](in_stack_ffffffffffffff58,(index)idx);
  boost::detail::multi_array::
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  ::operator[]((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                *)in_stack_ffffffffffffff58,(index)idx);
  this_00 = (E *)boost::detail::multi_array::
                 sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                 ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pmVar3 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)this_00->_vptr_E;
  boost::detail::multi_array::
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
  ::~sub_array((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                *)0x942677);
  boost::detail::multi_array::
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  ::~sub_array((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                *)0x942684);
  if (pmVar3 == (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)0x0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(this_00,(char *)pmVar3);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  if (local_14 == -1) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(this_00,(char *)pmVar3);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  boost::
  multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL>
  ::operator[](in_stack_ffffffffffffff58,(index)idx);
  boost::detail::multi_array::
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  ::operator[]((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                *)in_stack_ffffffffffffff58,(index)idx);
  ppmVar2 = boost::detail::multi_array::
            sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
            ::operator[]((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                          *)this_00,(index)pmVar3);
  pmVar3 = *ppmVar2;
  boost::detail::multi_array::
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
  ::~sub_array((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                *)0x942811);
  boost::detail::multi_array::
  sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  ::~sub_array((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                *)0x94281b);
  return pmVar3;
}

Assistant:

VectorSet* TreeIncPruneBGPlanner::GetGaoa(Index a, Index o, Index aPrime) const
{
    if((*_m_Gaoa)[a][o][aPrime]==0)
        throw(E("TreeIncPruneBGPlanner::GetGaoa set should have been computed"));

    if(aPrime==UNSPECIFIED_ACTION)
        throw(E("TreeIncPruneBGPlanner::GetGaoa the next time step action should be specified"));

    return((*_m_Gaoa)[a][o][aPrime]);
}